

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version.cpp
# Opt level: O2

version_constant __thiscall setup::version::next(version *this)

{
  _WordT _Var1;
  undefined1 *puVar2;
  version_constant *pvVar3;
  ulong uVar4;
  difference_type __d;
  ulong uVar5;
  
  puVar2 = (anonymous_namespace)::legacy_versions;
  uVar5 = 2;
  while (uVar4 = uVar5, 0 < (long)uVar4) {
    uVar5 = uVar4 >> 1;
    if (*(uint *)(puVar2 + uVar5 * 0x20 + 0x10) <= this->value) {
      puVar2 = puVar2 + uVar5 * 0x20 + 0x20;
      uVar5 = ~uVar5 + uVar4;
    }
  }
  _Var1 = (this->variant)._flags.super__Base_bitset<1UL>._M_w;
  do {
    if (puVar2 == &(anonymous_namespace)::versions) {
      puVar2 = &(anonymous_namespace)::versions;
      uVar5 = 0x72;
      while (uVar4 = uVar5, 0 < (long)uVar4) {
        uVar5 = uVar4 >> 1;
        if (*(uint *)(puVar2 + uVar5 * 0x50 + 0x40) <= this->value) {
          puVar2 = puVar2 + uVar5 * 0x50 + 0x50;
          uVar5 = ~uVar5 + uVar4;
        }
      }
      while( true ) {
        if (puVar2 == &std::__ioinit) {
          return 0;
        }
        if (*(_WordT *)(puVar2 + 0x48) == _Var1) break;
        puVar2 = puVar2 + 0x50;
      }
      pvVar3 = (version_constant *)(puVar2 + 0x40);
LAB_0013b6ee:
      return *pvVar3;
    }
    if (*(_WordT *)(puVar2 + 0x18) == _Var1) {
      pvVar3 = (version_constant *)(puVar2 + 0x10);
      goto LAB_0013b6ee;
    }
    puVar2 = puVar2 + 0x20;
  } while( true );
}

Assistant:

version_constant version::next() {
	
	const known_legacy_version * legacy_end = boost::end(legacy_versions);
	const known_legacy_version * legacy_result;
	legacy_result = std::upper_bound(boost::begin(legacy_versions), legacy_end, value);
	while(legacy_result != legacy_end && legacy_result->variant != variant) {
		legacy_result++;
	}
	if(legacy_result != legacy_end) {
		return legacy_result->version;
	}
	 
	const known_version * end = boost::end(versions);
	const known_version * result = std::upper_bound(boost::begin(versions), end, value);
	while(result != end && result->variant != variant) {
		result++;
	}
	if(result != end) {
		return result->version;
	}
	
	return 0;
}